

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_regex.cc
# Opt level: O3

string * escape_char(string *__return_storage_ptr__,string *s)

{
  ulong uVar1;
  char cVar2;
  size_type sVar3;
  pointer pcVar4;
  int iVar5;
  char *__s;
  ulong uVar6;
  size_t sVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  
  sVar3 = s->_M_string_length;
  __s = (char *)operator_new__(sVar3 * 2 + 1);
  uVar6 = 0;
  iVar11 = (int)sVar3;
  if (0 < iVar11) {
    pcVar4 = (s->_M_dataplus)._M_p;
    uVar8 = 0;
    do {
      cVar2 = pcVar4[(int)uVar8];
      iVar5 = (int)uVar6;
      if (cVar2 == '\"') {
        (__s + iVar5)[0] = '\\';
        (__s + iVar5)[1] = '\"';
        uVar6 = (ulong)(iVar5 + 2);
LAB_00123f7e:
        uVar9 = (ulong)uVar8;
      }
      else {
        if (cVar2 != '\\') {
          uVar6 = (ulong)(iVar5 + 1);
          __s[iVar5] = cVar2;
          goto LAB_00123f7e;
        }
        uVar9 = (long)(int)uVar8 + 1;
        if (iVar11 <= (int)uVar9) goto LAB_00123f7e;
        lVar10 = (long)iVar5;
        uVar1 = lVar10 + 1;
        __s[lVar10] = '\\';
        cVar2 = pcVar4[uVar9];
        if ((cVar2 == '\"') || (cVar2 == '\\')) {
          uVar6 = (ulong)(iVar5 + 2);
          __s[uVar1] = cVar2;
        }
        else {
          if (cVar2 != '/') {
            uVar6 = (ulong)(iVar5 + 2);
            __s[uVar1] = '\\';
            goto LAB_00123f7e;
          }
          __s[lVar10] = '/';
          uVar6 = uVar1 & 0xffffffff;
        }
      }
      uVar8 = (int)uVar9 + 1;
    } while ((int)uVar8 < iVar11);
    uVar6 = (ulong)(int)uVar6;
  }
  __s[uVar6] = '\0';
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar7 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,__s + sVar7);
  operator_delete__(__s);
  return __return_storage_ptr__;
}

Assistant:

string escape_char(const string& s)
	{
	char* buf = new char[s.length() * 2 + 1];
	int j = 0;
	for ( int i = 0; i < (int)s.length(); ++i )
		{
		if ( s[i] == '\\' )
			{
			if ( i + 1 < (int)s.length() )
				{
				buf[j++] = '\\';
				if ( s[i + 1] == '/' )
					buf[j - 1] = s[++i];
				else if ( s[i + 1] == '/' || s[i + 1] == '\\' || s[i + 1] == '"' )
					buf[j++] = s[++i];
				else
					buf[j++] = '\\';
				}
			}
		else if ( s[i] == '"' )
			{
			buf[j++] = '\\';
			buf[j++] = '"';
			}
		else
			{
			buf[j++] = s[i];
			}
		}

	buf[j++] = '\0';

	string rval = buf;
	delete[] buf;
	return rval;
	}